

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfStringAttribute.cpp
# Opt level: O0

void __thiscall
Imf_3_4::
TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
readValueFrom(TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *this,IStream *is,int size,int version)

{
  int in_EDX;
  IStream *in_RSI;
  long in_RDI;
  int i;
  char *in_stack_ffffffffffffffc8;
  IStream *in;
  undefined4 local_1c;
  
  std::__cxx11::string::resize(in_RDI + 8);
  for (local_1c = 0; local_1c < in_EDX; local_1c = local_1c + 1) {
    in = in_RSI;
    std::__cxx11::string::operator[](in_RDI + 8);
    Xdr::read<Imf_3_4::StreamIO,Imf_3_4::IStream>(in,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

IMF_EXPORT void
TypedAttribute<std::string>::readValueFrom (
    OPENEXR_IMF_INTERNAL_NAMESPACE::IStream& is, int size, int version)
{
    _value.resize (size);

    for (int i = 0; i < size; i++)
        Xdr::read<StreamIO> (is, _value[i]);
}